

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.hpp
# Opt level: O3

int __thiscall
Map<unsigned_int,_Error::Private::Str>::remove
          (Map<unsigned_int,_Error::Private::Str> *this,char *__filename)

{
  Item *pIVar1;
  Item *pIVar2;
  usize uVar3;
  char *pcVar4;
  code *pcVar5;
  int iVar6;
  Item *pIVar7;
  Item *pIVar8;
  Item *pIVar9;
  Iterator *pIVar10;
  Item *pIVar11;
  Item **ppIVar12;
  Item *pIVar13;
  
  pIVar1 = *(Item **)__filename;
  pIVar8 = pIVar1->parent;
  if (pIVar8 == (Item *)0x0) {
    ppIVar12 = &this->root;
  }
  else {
    ppIVar12 = &pIVar8->right;
    if (pIVar1 == pIVar8->left) {
      ppIVar12 = &pIVar8->left;
    }
  }
  if ((*ppIVar12 != pIVar1) &&
     (iVar6 = Debug::printf("%s:%u: assertion failed: %s\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/../include/nstd/Map.hpp"
                            ,0xc9,"*cell == item"), iVar6 != 0)) goto LAB_00103b4e;
  pIVar7 = pIVar1->left;
  pIVar11 = pIVar1->right;
  pIVar13 = pIVar8;
  if (pIVar7 == (Item *)0x0 && pIVar11 == (Item *)0x0) {
    *ppIVar12 = (Item *)0x0;
  }
  else if (pIVar7 == (Item *)0x0) {
    *ppIVar12 = pIVar11;
    pIVar11->parent = pIVar8;
  }
  else if (pIVar11 == (Item *)0x0) {
    *ppIVar12 = pIVar7;
    pIVar7->parent = pIVar8;
  }
  else {
    if (pIVar7->height < pIVar11->height) {
      pIVar9 = pIVar1->next;
      if ((pIVar9->left != (Item *)0x0) &&
         (iVar6 = Debug::printf("%s:%u: assertion failed: %s\n",
                                "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/../include/nstd/Map.hpp"
                                ,0xe4,"!next->left"), iVar6 != 0)) {
LAB_00103b4e:
        pcVar5 = (code *)invalidInstructionException();
        (*pcVar5)();
      }
      pIVar13 = pIVar9->parent;
      if (pIVar13 == pIVar1) {
        if ((pIVar9 != pIVar11) &&
           (iVar6 = Debug::printf("%s:%u: assertion failed: %s\n",
                                  "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/../include/nstd/Map.hpp"
                                  ,0xe8,"next == right"), iVar6 != 0)) goto LAB_00103b4e;
        *ppIVar12 = pIVar9;
        pIVar9->parent = pIVar8;
        pIVar9->left = pIVar7;
        pIVar11 = pIVar7;
        pIVar13 = pIVar9;
      }
      else {
        if ((pIVar9 != pIVar13->left) &&
           (iVar6 = Debug::printf("%s:%u: assertion failed: %s\n",
                                  "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/../include/nstd/Map.hpp"
                                  ,0xf3,"next == nextParent->left"), iVar6 != 0)) goto LAB_00103b4e;
        pIVar2 = pIVar9->right;
        pIVar13->left = pIVar2;
        if (pIVar2 != (Item *)0x0) {
          pIVar2->parent = pIVar13;
        }
        *ppIVar12 = pIVar9;
        pIVar9->parent = pIVar8;
        pIVar9->left = pIVar7;
        pIVar7->parent = pIVar9;
        pIVar9->right = pIVar11;
      }
    }
    else {
      pIVar9 = pIVar1->prev;
      if ((pIVar9->right != (Item *)0x0) &&
         (iVar6 = Debug::printf("%s:%u: assertion failed: %s\n",
                                "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/../include/nstd/Map.hpp"
                                ,0x10d,"!prev->right"), iVar6 != 0)) goto LAB_00103b4e;
      pIVar13 = pIVar9->parent;
      if (pIVar13 == pIVar1) {
        if ((pIVar9 != pIVar7) &&
           (iVar6 = Debug::printf("%s:%u: assertion failed: %s\n",
                                  "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/../include/nstd/Map.hpp"
                                  ,0x111,"prev == left"), iVar6 != 0)) goto LAB_00103b4e;
        *ppIVar12 = pIVar9;
        pIVar9->parent = pIVar8;
        pIVar9->right = pIVar11;
        pIVar13 = pIVar9;
      }
      else {
        if ((pIVar9 != pIVar13->right) &&
           (iVar6 = Debug::printf("%s:%u: assertion failed: %s\n",
                                  "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/../include/nstd/Map.hpp"
                                  ,0x11c,"prev == prevParent->right"), iVar6 != 0))
        goto LAB_00103b4e;
        pIVar2 = pIVar9->left;
        pIVar13->right = pIVar2;
        if (pIVar2 != (Item *)0x0) {
          pIVar2->parent = pIVar13;
        }
        *ppIVar12 = pIVar9;
        pIVar9->parent = pIVar8;
        pIVar9->right = pIVar11;
        pIVar11->parent = pIVar9;
        pIVar9->left = pIVar7;
        pIVar11 = pIVar7;
      }
    }
    pIVar11->parent = pIVar9;
    do {
      uVar3 = pIVar13->height;
      Item::updateHeightAndSlope(pIVar13);
      pIVar7 = rebal(this,pIVar13);
      if (uVar3 == pIVar7->height) {
        pIVar8 = *ppIVar12;
        Item::updateHeightAndSlope(pIVar8);
        pIVar8 = rebal(this,pIVar8);
        goto LAB_00103b72;
      }
      pIVar13 = pIVar7->parent;
    } while (pIVar13 != pIVar8);
  }
  while (pIVar13 != (Item *)0x0) {
    uVar3 = pIVar13->height;
    Item::updateHeightAndSlope(pIVar13);
    pIVar8 = rebal(this,pIVar13);
    if (uVar3 == pIVar8->height) break;
LAB_00103b72:
    pIVar13 = pIVar8->parent;
  }
  pIVar8 = pIVar1->next;
  pIVar7 = pIVar1->prev;
  pIVar10 = (Iterator *)&pIVar7->next;
  if (pIVar7 == (Item *)0x0) {
    pIVar10 = &this->_begin;
  }
  pIVar10->item = pIVar8;
  pIVar8->prev = pIVar7;
  this->_size = this->_size - 1;
  pcVar4 = (pIVar1->value)._ptr;
  if (pcVar4 != (char *)0x0) {
    operator_delete__(pcVar4);
    pIVar8 = pIVar1->next;
  }
  pIVar1->prev = this->freeItem;
  this->freeItem = pIVar1;
  return (int)pIVar8;
}

Assistant:

Iterator remove(const Iterator& it)
  {
    Item* item = it.item;
    Item* origParent;
    Item* parent = origParent = item->parent;
    Item** cell = parent ? (item == parent->left ? &parent->left : &parent->right) : &root;
    ASSERT(*cell == item);
    Item* left = item->left;
    Item* right = item->right;

    if(!left && !right)
    {
      *cell = 0;
      goto rebalParentUpwards;
    }

    if(!left)
    {
      *cell = right;
      right->parent = parent;
      goto rebalParentUpwards;
    }

    if(!right)
    {
      *cell = left;
      left->parent = parent;
      goto rebalParentUpwards;
    }

    if(left->height < right->height)
    {
      Item* next = item->next;
      ASSERT(!next->left);
      Item* nextParent = next->parent;
      if(nextParent == item)
      {
        ASSERT(next == right);
        *cell = next;
        next->parent = parent;

        next->left = left;
        left->parent = next;
        parent = next;
        goto rebalParent;
      }

      // unlink next
      ASSERT(next == nextParent->left);
      Item* nextRight = next->right;
      nextParent->left = nextRight;
      if(nextRight)
        nextRight->parent = nextParent;
      
      // put next in cell
      *cell = next;
      next->parent = parent;

      // link left to next left
      next->left = left;
      left->parent = next;

      // link right to next right
      next->right = right;
      right->parent = next;

      // rebal old next->parent
      parent = nextParent;
      ASSERT(parent);
      goto rebalParent;
    }
    else
    {
      Item* prev = item->prev;
      ASSERT(!prev->right);
      Item* prevParent = prev->parent;
      if(prevParent == item)
      {
        ASSERT(prev == left);
        *cell = prev;
        prev->parent = parent;

        prev->right = right;
        right->parent = prev;
        parent = prev;
        goto rebalParent;
      }

      // unlink prev
      ASSERT(prev == prevParent->right);
      Item* prevLeft = prev->left;
      prevParent->right = prevLeft;
      if(prevLeft)
        prevLeft->parent = prevParent;

      // put prev in cell
      *cell = prev;
      prev->parent = parent;

      // link right to prev right
      prev->right = right;
      right->parent = prev;

      // link left to prev left
      prev->left = left;
      left->parent = prev;

      // rebal old prev->parent
      parent = prevParent;
      ASSERT(parent);
      goto rebalParent;
    }

    // rebal parent upwards
  rebalParent:
    do
    {
      usize oldHeight = parent->height;
      parent->updateHeightAndSlope();
      parent = rebal(parent);
      if(oldHeight == parent->height)
      {
        parent = *cell;
        parent->updateHeightAndSlope();
        parent = rebal(parent);
        parent = parent->parent;
        break;
      }
      parent = parent->parent;
    } while(parent != origParent);
  rebalParentUpwards:
    while(parent)
    {
      usize oldHeight = parent->height;
      parent->updateHeightAndSlope();
      parent = rebal(parent);
      if(oldHeight == parent->height)
        break;
      parent = parent->parent;
    }

    if(!item->prev)
      (_begin.item = item->next)->prev = 0;
    else
      (item->prev->next = item->next)->prev = item->prev;
    --_size;

    item->~Item();
    item->prev = freeItem;
    freeItem = item;
    return item->next;
  }